

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int walIndexPage(Wal *pWal,int iPage,u32 **ppPage)

{
  int iVar1;
  u32 **ppuVar2;
  u32 *puVar3;
  long lVar4;
  
  lVar4 = (long)iPage;
  if (iPage < pWal->nWiData) {
    ppuVar2 = pWal->apWiData;
  }
  else {
    iVar1 = (int)(lVar4 + 1);
    ppuVar2 = (u32 **)sqlite3_realloc64(pWal->apWiData,(long)(iVar1 * 8));
    if (ppuVar2 == (u32 **)0x0) {
      iVar1 = 7;
      puVar3 = (u32 *)0x0;
      goto LAB_0011ffde;
    }
    memset(ppuVar2 + pWal->nWiData,0,((lVar4 + 1) - (long)pWal->nWiData) * 8);
    pWal->apWiData = ppuVar2;
    pWal->nWiData = iVar1;
  }
  iVar1 = 0;
  if (ppuVar2[lVar4] == (u32 *)0x0) {
    if (pWal->exclusiveMode == '\x02') {
      puVar3 = (u32 *)sqlite3MallocZero(0x8000);
      pWal->apWiData[lVar4] = puVar3;
      iVar1 = 7;
      if (pWal->apWiData[lVar4] != (u32 *)0x0) {
        iVar1 = 0;
      }
    }
    else {
      iVar1 = (*pWal->pDbFd->pMethods->xShmMap)
                        (pWal->pDbFd,iPage,0x8000,(int)pWal->writeLock,ppuVar2 + lVar4);
      if (iVar1 == 8) {
        pWal->readOnly = pWal->readOnly | 2;
        iVar1 = 0;
      }
    }
  }
  puVar3 = pWal->apWiData[lVar4];
LAB_0011ffde:
  *ppPage = puVar3;
  return iVar1;
}

Assistant:

static int walIndexPage(Wal *pWal, int iPage, volatile u32 **ppPage){
  int rc = SQLITE_OK;

  /* Enlarge the pWal->apWiData[] array if required */
  if( pWal->nWiData<=iPage ){
    int nByte = sizeof(u32*)*(iPage+1);
    volatile u32 **apNew;
    apNew = (volatile u32 **)sqlite3_realloc64((void *)pWal->apWiData, nByte);
    if( !apNew ){
      *ppPage = 0;
      return SQLITE_NOMEM_BKPT;
    }
    memset((void*)&apNew[pWal->nWiData], 0,
           sizeof(u32*)*(iPage+1-pWal->nWiData));
    pWal->apWiData = apNew;
    pWal->nWiData = iPage+1;
  }

  /* Request a pointer to the required page from the VFS */
  if( pWal->apWiData[iPage]==0 ){
    if( pWal->exclusiveMode==WAL_HEAPMEMORY_MODE ){
      pWal->apWiData[iPage] = (u32 volatile *)sqlite3MallocZero(WALINDEX_PGSZ);
      if( !pWal->apWiData[iPage] ) rc = SQLITE_NOMEM_BKPT;
    }else{
      rc = sqlite3OsShmMap(pWal->pDbFd, iPage, WALINDEX_PGSZ, 
          pWal->writeLock, (void volatile **)&pWal->apWiData[iPage]
      );
      if( rc==SQLITE_READONLY ){
        pWal->readOnly |= WAL_SHM_RDONLY;
        rc = SQLITE_OK;
      }
    }
  }

  *ppPage = pWal->apWiData[iPage];
  assert( iPage==0 || *ppPage || rc!=SQLITE_OK );
  return rc;
}